

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> * __thiscall
testing::internal::UnorderedElementsAreArrayMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> *__return_storage_ptr__,
          UnorderedElementsAreArrayMatcher *this)

{
  UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&> *this_00;
  
  this_00 = (UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&> *)
            operator_new(0x40);
  UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&>::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>>
            (this_00,*(Flags *)this,
             (__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>)
             *(void ***)(this + 8),
             (__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>)
             *(void ***)(this + 0x10));
  Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&>::Matcher
            (__return_storage_ptr__,
             (MatcherInterface<const_std::vector<void_*,_std::allocator<void_*>_>_&> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    return Matcher<Container>(
        new UnorderedElementsAreMatcherImpl<const Container&>(
            match_flags_, matchers_.begin(), matchers_.end()));
  }